

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O2

void * SZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_uint8 *pPVar1;
  ulong *puVar2;
  PHYSFS_uint8 *pPVar3;
  Byte BVar4;
  bool bVar5;
  Int64 IVar6;
  int __result__;
  int iVar7;
  SRes SVar8;
  PHYSFS_ErrorCode PVar9;
  UInt32 UVar10;
  SRes SVar11;
  uint uVar12;
  UInt32 UVar13;
  uint uVar14;
  PHYSFS_uint64 PVar15;
  PHYSFS_sint64 PVar16;
  SZIPinfo *info;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  size_t *psVar20;
  UInt32 *pUVar21;
  UInt64 *pUVar22;
  Byte *pBVar23;
  ulong uVar24;
  UInt64 UVar25;
  byte bVar26;
  byte bVar27;
  ISzAlloc *pIVar28;
  ulong uVar29;
  byte bVar30;
  PHYSFS_uint32 idx;
  _func_void_void_ptr_void_ptr *p_Var32;
  size_t sVar34;
  uint uVar35;
  CSzBitUi64s *p;
  CSzData *sd2;
  CSzAr *in_R9;
  CSzAr *dataOffset;
  ulong uVar36;
  CSzBitUi32s *pCVar37;
  _func_void_void_ptr_void_ptr *__n;
  bool bVar38;
  ISzAlloc *in_stack_ffffffffffffbd78;
  uint in_stack_ffffffffffffbd80;
  ulong local_4278;
  byte local_4270;
  UInt64 type_1;
  CSzData sd;
  UInt32 *local_4230;
  ISzAlloc *local_4228;
  Byte *local_4220;
  ulong local_4218;
  Byte *local_4210;
  Byte *local_41f8;
  Byte *local_41f0;
  UInt64 type;
  UInt32 index_1;
  UInt32 numFiles;
  PHYSFS_uint8 sig [6];
  CSubStreamInfo local_41c8;
  Int64 startArcPos;
  UInt64 size;
  UInt64 type2;
  _func_void_void_ptr_void_ptr *p_Stack_4170;
  Byte *local_4168;
  UInt32 *pUStack_4160;
  size_t *local_4158;
  UInt32 *pUStack_4150;
  UInt32 *local_4148;
  Byte *pBStack_4140;
  UInt64 *local_4138;
  Byte *pBStack_4130;
  Byte header [32];
  Int64 pos;
  _func_void_void_ptr_void_ptr *p_Stack_4100;
  Byte *local_40f8;
  UInt32 *pUStack_40f0;
  size_t *local_40e8;
  UInt32 *pUStack_40e0;
  UInt32 *local_40d8;
  Byte *pBStack_40d0;
  UInt64 *local_40c8;
  Byte *pBStack_40c0;
  code *local_4080;
  code *local_4078;
  PHYSFS_Io *local_4070;
  ILookInStream local_4068;
  code **local_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  byte bVar31;
  _func_void_void_ptr_void_ptr *p_Var33;
  
  if (forWriting != 0) {
    PVar9 = PHYSFS_ERR_READ_ONLY;
LAB_0010cb75:
    PHYSFS_setErrorCode(PVar9);
    return (void *)0x0;
  }
  PVar15 = (*io->tell)(io);
  if (PVar15 == 0xffffffffffffffff) {
    return (void *)0x0;
  }
  PVar16 = (*io->read)(io,sig,6);
  if (PVar16 != 6) {
    return (void *)0x0;
  }
  iVar7 = bcmp(sig,SZIP_openArchive::wantedsig,6);
  *claimed = (uint)(iVar7 == 0);
  iVar7 = (*io->seek)(io,PVar15);
  if (iVar7 == 0) {
    return (void *)0x0;
  }
  info = (SZIPinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0x108);
  if (info == (SZIPinfo *)0x0) {
    PVar9 = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_0010cb75;
  }
  memset(info,0,0x108);
  info->io = io;
  local_4048 = &local_4080;
  local_4080 = SZIP_ISeekInStream_Read;
  local_4078 = SZIP_ISeekInStream_Seek;
  local_4068.Look = LookToRead_Look_Exact;
  local_4068.Skip = LookToRead_Skip;
  local_4068.Read = LookToRead_Read;
  pIVar28 = (ISzAlloc *)&startArcPos;
  startArcPos = 0;
  local_4068.Seek = LookToRead_Seek;
  local_4040 = 0;
  uStack_4038 = 0;
  local_4070 = io;
  SVar8 = SZIP_ISeekInStream_Seek(local_4048,(Int64 *)pIVar28,SZ_SEEK_CUR);
  if (SVar8 == 0) {
    pIVar28 = (ISzAlloc *)header;
    SVar11 = 0x11;
    SVar8 = LookInStream_Read2(&local_4068,pIVar28,0x20,0x11);
    IVar6 = startArcPos;
    if (SVar8 == 0) {
      dataOffset = (CSzAr *)&(info->db).dataPos;
      lVar18 = 0;
LAB_0010cced:
      pIVar28 = (ISzAlloc *)dataOffset;
      SVar8 = SVar11;
      if (lVar18 != 6) goto code_r0x0010ccf3;
      if (header[6] != '\0') {
        SVar8 = 4;
        goto LAB_0010ccb4;
      }
      pIVar28 = (ISzAlloc *)(header + 0xc);
      (info->db).startPosAfterHeader = startArcPos + 0x20;
      UVar10 = (*g_CrcUpdate)(0xffffffff,pIVar28,0x14,g_CrcTable);
      if ((UVar10 ^ header._8_4_) != 0xffffffff) {
        SVar8 = 3;
        goto LAB_0010ccb4;
      }
      if (header._20_8_ == 0) goto LAB_0010d0a8;
      if ((CARRY8(header._12_8_,header._20_8_)) || (-header._20_8_ - 0x21 < (ulong)header._12_8_))
      goto LAB_0010ccb4;
      pIVar28 = (ISzAlloc *)&pos;
      pos = 0;
      SVar8 = (*local_4068.Seek)(&local_4068,(Int64 *)pIVar28,SZ_SEEK_END);
      if (SVar8 != 0) goto LAB_0010ccb4;
      uVar19 = IVar6 + header._12_8_;
      if ((ulong)pos < uVar19) {
        SVar8 = 6;
        goto LAB_0010ccb4;
      }
      uVar17 = IVar6 + header._12_8_ + 0x20;
      SVar8 = 6;
      if (((ulong)pos < uVar17) ||
         (pIVar28 = (ISzAlloc *)header._20_8_, (ulong)pos < uVar19 + header._20_8_ + 0x20))
      goto LAB_0010ccb4;
      pIVar28 = (ISzAlloc *)&pos;
      pos = uVar17;
      SVar8 = (*local_4068.Seek)(&local_4068,(Int64 *)pIVar28,SZ_SEEK_SET);
      if ((SVar8 != 0) ||
         (pIVar28 = (ISzAlloc *)header._20_8_,
         local_4228 = (ISzAlloc *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,header._20_8_), SVar8 = 2,
         local_4228 == (ISzAlloc *)0x0)) goto LAB_0010ccb4;
      SVar8 = LookInStream_Read2(&local_4068,local_4228,header._20_8_,6);
      if (SVar8 != 0) goto LAB_0010d088;
      UVar10 = (*g_CrcUpdate)(0xffffffff,local_4228,header._20_8_,g_CrcTable);
      if ((UVar10 ^ header._28_4_) != 0xffffffff) {
        SVar8 = 0x10;
        goto LAB_0010d088;
      }
      sd.Size._0_1_ = header[0x14];
      sd.Size._1_1_ = header[0x15];
      sd.Size._2_1_ = header[0x16];
      sd.Size._3_1_ = header[0x17];
      sd.Size._4_1_ = header[0x18];
      sd.Size._5_1_ = header[0x19];
      sd.Size._6_1_ = header[0x1a];
      sd.Size._7_1_ = header[0x1b];
      sd.Data = (Byte *)local_4228;
      SVar8 = ReadNumber(&sd,&type);
      if ((SVar8 == 0) && (type == 0x17)) {
        type2 = 0;
        p_Stack_4170 = (_func_void_void_ptr_void_ptr *)0x0;
        pos = 0;
        p_Stack_4100 = (_func_void_void_ptr_void_ptr *)0x0;
        local_40f8 = (Byte *)0x0;
        pUStack_40f0 = (UInt32 *)0x0;
        local_40e8 = (size_t *)0x0;
        pUStack_40e0 = (UInt32 *)0x0;
        local_40d8 = (UInt32 *)0x0;
        pBStack_40d0 = (Byte *)0x0;
        local_40c8 = (UInt64 *)0x0;
        pBStack_40c0 = (Byte *)0x0;
        pIVar28 = (ISzAlloc *)&sd;
        in_R9 = (CSzAr *)&pos;
        SVar8 = SzReadAndDecodePackedStreams
                          (&local_4068,(CSzData *)pIVar28,(CBuf *)&type2,1,
                           (info->db).startPosAfterHeader,(CSzAr *)&pos,in_stack_ffffffffffffbd78);
        SzAr_Free((CSzAr *)&pos,pIVar28);
        if (SVar8 == 0) {
          (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_4228);
          local_4228 = (ISzAlloc *)type2;
          sd.Data = (Byte *)type2;
          sd.Size = (size_t)p_Stack_4170;
          SVar8 = ReadNumber(&sd,&type);
        }
        else {
          (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)type2);
        }
      }
      if (SVar8 != 0) goto LAB_0010d088;
      if (type != 1) {
        SVar8 = 4;
        goto LAB_0010d088;
      }
      for (lVar18 = 0; lVar18 != 0x80; lVar18 = lVar18 + 0x10) {
        *(undefined8 *)((long)&pos + lVar18) = 0;
        *(undefined8 *)((long)&p_Stack_4100 + lVar18) = 0;
      }
      local_41c8.NumTotalSubStreams = 0;
      local_41c8.NumSubDigests = 0;
      local_41c8.sdNumSubStreams.Data = (Byte *)0x0;
      local_41c8.sdNumSubStreams.Size = 0;
      local_41c8.sdSizes.Data = (Byte *)0x0;
      local_41c8.sdSizes.Size = 0;
      local_41c8.sdCRCs.Data = (Byte *)0x0;
      local_41c8.sdCRCs.Size = 0;
      SVar11 = ReadNumber(&sd,&type_1);
      if (SVar11 != 0) goto LAB_0010d038;
      lVar18 = CONCAT44(type_1._4_4_,(uint)type_1);
      if (lVar18 != 2) {
LAB_0010d156:
        local_4278._0_4_ = 0;
        if (lVar18 == 3) {
          local_4138 = (UInt64 *)0x0;
          pBStack_4130 = (Byte *)0x0;
          local_4148 = (UInt32 *)0x0;
          pBStack_4140 = (Byte *)0x0;
          local_4158 = (size_t *)0x0;
          pUStack_4150 = (UInt32 *)0x0;
          local_4168 = (Byte *)0x0;
          pUStack_4160 = (UInt32 *)0x0;
          type2 = 0;
          p_Stack_4170 = (_func_void_void_ptr_void_ptr *)0x0;
          pIVar28 = (ISzAlloc *)&sd;
          in_R9 = (CSzAr *)&type2;
          SVar11 = SzReadAndDecodePackedStreams
                             (&local_4068,(CSzData *)pIVar28,(CBuf *)&pos,8,
                              (info->db).startPosAfterHeader,(CSzAr *)&type2,
                              in_stack_ffffffffffffbd78);
          local_4278._0_4_ = (UInt32)(type2 >> 0x20);
          SzAr_Free((CSzAr *)&type2,pIVar28);
          if ((SVar11 != 0) || (SVar11 = ReadNumber(&sd,&type_1), SVar11 != 0)) goto LAB_0010d038;
          lVar18 = CONCAT44(type_1._4_4_,(uint)type_1);
        }
        if (lVar18 == 4) {
          SVar11 = SzReadStreamsInfo(&(info->db).db,&sd,0x40000000,(CBuf *)&pos,(UInt32)local_4278,
                                     (UInt64 *)dataOffset,&local_41c8,
                                     (ISzAlloc *)(ulong)in_stack_ffffffffffffbd80);
          if (SVar11 == 0) {
            pUVar22 = &(info->db).dataPos;
            *pUVar22 = *pUVar22 + (info->db).startPosAfterHeader;
            SVar11 = ReadNumber(&sd,&type_1);
            if (SVar11 == 0) {
              lVar18 = CONCAT44(type_1._4_4_,(uint)type_1);
              in_R9 = dataOffset;
              goto LAB_0010d268;
            }
          }
          goto LAB_0010d038;
        }
LAB_0010d268:
        if (lVar18 == 0) goto LAB_0010dd17;
        if (lVar18 != 5) goto LAB_0010dd24;
        numFiles = 0;
        SVar11 = SzReadNumber32(&sd,&numFiles);
        UVar10 = numFiles;
        if (SVar11 != 0) goto LAB_0010d038;
        uVar17 = (ulong)numFiles;
        (info->db).NumFiles = numFiles;
        pCVar37 = &(info->db).Attribs;
        uVar19 = (ulong)(numFiles + 7 >> 3);
        uVar12 = numFiles + 1;
        local_41f8 = (Byte *)0x0;
        SVar8 = 0x10;
        UVar13 = 0;
LAB_0010d30e:
        uVar36 = (ulong)(UVar13 + 7 >> 3);
        local_41f0 = (Byte *)0x0;
LAB_0010d32a:
        do {
          while( true ) {
            SVar11 = ReadNumber(&sd,&type_1);
            uVar35 = (uint)type_1;
            if (SVar11 != 0) goto LAB_0010d038;
            uVar24 = CONCAT44(type_1._4_4_,(uint)type_1);
            if (uVar24 == 0) {
              if (UVar10 - UVar13 != local_41c8.NumTotalSubStreams) goto LAB_0010dd24;
              goto LAB_0010d68c;
            }
            SVar11 = ReadNumber(&sd,&size);
            pBVar23 = sd.Data;
            if ((SVar11 != 0) ||
               (pIVar28 = (ISzAlloc *)(sd.Size - size), SVar11 = SVar8, sd.Size < size))
            goto LAB_0010d038;
            if (uVar24 < 0x100) break;
switchD_0010d3ad_caseD_10:
            sd.Data = sd.Data + size;
            sd.Size = (size_t)pIVar28;
          }
          switch(uVar35 & 0xff) {
          case 0xe:
            goto switchD_0010d3ad_caseD_e;
          case 0xf:
            if (sd.Size < uVar36) goto LAB_0010d038;
            local_41f0 = sd.Data;
            sd.Data = sd.Data + uVar36;
            sd.Size = sd.Size - uVar36;
            goto LAB_0010d32a;
          default:
            goto switchD_0010d3ad_caseD_10;
          case 0x11:
            if (sd.Size == 0) goto LAB_0010d038;
            sd.Size = sd.Size - 1;
            p_Var32 = (_func_void_void_ptr_void_ptr *)(sd.Data + 1);
            BVar4 = *sd.Data;
            sd.Data = (Byte *)p_Var32;
            if (BVar4 == '\0') {
              __n = (_func_void_void_ptr_void_ptr *)(size - 1);
            }
            else {
              SVar11 = SzReadNumber32(&sd,(UInt32 *)&type2);
              if (SVar11 != 0) goto LAB_0010d038;
              SVar11 = SVar8;
              if ((UInt32)local_4278 <= (uint)type2) goto LAB_0010d038;
              p_Var32 = (&p_Stack_4100)[(type2 & 0xffffffff) * 2 + -1];
              __n = (&p_Stack_4100)[(type2 & 0xffffffff) * 2];
            }
            SVar11 = SVar8;
            if (((ulong)__n & 1) != 0) goto LAB_0010d038;
            psVar20 = (size_t *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)uVar12 << 3);
            (info->db).FileNameOffsets = psVar20;
            if (psVar20 != (size_t *)0x0) {
              pBVar23 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)__n);
              (info->db).FileNames = pBVar23;
              if (pBVar23 != (Byte *)0x0) {
                memcpy(pBVar23,p_Var32,(size_t)__n);
                psVar20 = (info->db).FileNameOffsets;
                pBVar23 = (info->db).FileNames;
                *psVar20 = 0;
                SVar11 = SVar8;
                if ((((UVar10 == 0) || (__n < (_func_void_void_ptr_void_ptr *)0x2)) ||
                    (pBVar23[(long)(__n + -2)] != '\0')) || (pBVar23[(long)(__n + -1)] != '\0'))
                goto LAB_0010d038;
                p_Var32 = (_func_void_void_ptr_void_ptr *)0x0;
                uVar24 = uVar17;
                do {
                  if (p_Var32 == __n) goto LAB_0010d038;
                  psVar20 = psVar20 + 1;
                  do {
                    do {
                      p_Var33 = p_Var32;
                      p_Var32 = p_Var33 + 2;
                    } while (pBVar23[(long)p_Var33] != '\0');
                  } while (pBVar23[(long)(p_Var33 + 1)] != '\0');
                  *psVar20 = (ulong)p_Var32 >> 1;
                  uVar35 = (int)uVar24 - 1;
                  uVar24 = (ulong)uVar35;
                } while (uVar35 != 0);
                if (__n != p_Var32) goto LAB_0010d038;
                if (BVar4 == '\0') {
                  sd.Data = sd.Data + (long)__n;
                  sd.Size = sd.Size - (long)__n;
                }
                goto LAB_0010d32a;
              }
            }
            SVar11 = 2;
            goto LAB_0010d038;
          case 0x12:
            p = &(info->db).CTime;
            break;
          case 0x14:
            p = &(info->db).MTime;
            break;
          case 0x15:
            SzBitUi32s_Free(pCVar37,(ISzAlloc *)&switchD_0010d3ad::switchdataD_0011bf80);
            SVar11 = ReadBitVector(&sd,UVar10,&pCVar37->Defs,pIVar28);
            if ((SVar11 != 0) || (SVar11 = SVar8, sd.Size == 0)) goto LAB_0010d038;
            sd.Size = sd.Size - 1;
            pIVar28 = (ISzAlloc *)(sd.Data + 1);
            BVar4 = *sd.Data;
            sd2 = &sd;
            sd.Data = (Byte *)pIVar28;
            if (BVar4 != '\0') {
              SVar11 = SzReadNumber32(&sd,&index_1);
              if ((SVar11 != 0) || (SVar11 = SVar8, (UInt32)local_4278 <= index_1))
              goto LAB_0010d038;
              type2 = (UInt64)(&p_Stack_4100)[(ulong)index_1 * 2 + -1];
              p_Stack_4170 = (&p_Stack_4100)[(ulong)index_1 * 2];
              sd2 = (CSzData *)&type2;
            }
            SVar11 = ReadUi32s(sd2,UVar10,pCVar37,pIVar28);
            goto LAB_0010d4f1;
          }
          SVar11 = ReadTime(p,UVar10,&sd,(CBuf *)&pos,(UInt32)local_4278,(ISzAlloc *)in_R9);
LAB_0010d4f1:
          if (SVar11 != 0) goto LAB_0010d038;
        } while( true );
      }
      while (SVar11 = ReadNumber(&sd,&type2), SVar11 == 0) {
        if (type2 == 0) {
          SVar11 = ReadNumber(&sd,&type_1);
          if (SVar11 == 0) {
            lVar18 = CONCAT44(type_1._4_4_,(uint)type_1);
            goto LAB_0010d156;
          }
          break;
        }
        SVar11 = SkipData(&sd);
        if (SVar11 != 0) break;
      }
      goto LAB_0010d038;
    }
  }
  goto LAB_0010ccb4;
code_r0x0010ccf3:
  pPVar3 = header + lVar18;
  pPVar1 = SZIP_openArchive::wantedsig + lVar18;
  lVar18 = lVar18 + 1;
  if (*pPVar3 != *pPVar1) goto LAB_0010ccb4;
  goto LAB_0010cced;
  while( true ) {
    if (type2 == 0) {
      type_1._0_4_ = 0;
      pUVar21 = (UInt32 *)
                (*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)((info->db).db.NumFolders + 1) << 2);
      (info->db).FolderToFile = pUVar21;
      SVar8 = 2;
      SVar11 = 2;
      if (pUVar21 == (UInt32 *)0x0) break;
      uVar19 = (ulong)(info->db).NumFiles;
      if (uVar19 == 0) {
        (info->db).FileToFolder = (UInt32 *)0x0;
        sVar34 = 8;
      }
      else {
        pUVar21 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,uVar19 << 2);
        (info->db).FileToFolder = pUVar21;
        SVar11 = SVar8;
        if (pUVar21 == (UInt32 *)0x0) break;
        sVar34 = (ulong)((info->db).NumFiles + 1) << 3;
      }
      pUVar22 = (UInt64 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar34);
      (info->db).UnpackPositions = pUVar22;
      SVar11 = SVar8;
      if (pUVar22 == (UInt64 *)0x0) break;
      uVar12 = (info->db).NumFiles;
      if (uVar12 + 7 < 8) {
        (info->db).IsDirs = (Byte *)0x0;
      }
      else {
        pBVar23 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)(uVar12 + 7 >> 3));
        (info->db).IsDirs = pBVar23;
        SVar11 = SVar8;
        if (pBVar23 == (Byte *)0x0) break;
        uVar12 = (info->db).NumFiles;
      }
      pCVar37 = &(info->db).CRCs;
      if (uVar12 == 0) {
        pCVar37->Defs = (Byte *)0x0;
        (info->db).CRCs.Vals = (UInt32 *)0x0;
        local_4230 = (UInt32 *)0x0;
      }
      else {
        pBVar23 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)uVar12 + 7 >> 3);
        pCVar37->Defs = pBVar23;
        SVar11 = SVar8;
        if (pBVar23 == (Byte *)0x0) break;
        local_4230 = (UInt32 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)uVar12 << 2);
        (info->db).CRCs.Vals = local_4230;
        SVar11 = SVar8;
        if (local_4230 == (UInt32 *)0x0) break;
      }
      bVar5 = true;
      if (local_41c8.sdCRCs.Size == 0) {
        local_4220 = (Byte *)0x0;
        local_4210 = (Byte *)0x0;
      }
      else {
        local_41c8.sdCRCs.Size = local_41c8.sdCRCs.Size - 1;
        pBVar23 = local_41c8.sdCRCs.Data + 1;
        if (*local_41c8.sdCRCs.Data == '\0') {
          local_4210 = pBVar23 + (local_41c8.NumSubDigests + 7 >> 3);
          local_4220 = pBVar23;
          local_41c8.sdCRCs.Data = pBVar23;
        }
        else {
          local_4220 = (Byte *)0x0;
          bVar5 = false;
          local_4210 = pBVar23;
          local_41c8.sdCRCs.Data = pBVar23;
        }
      }
      local_4270 = 0x80;
      SVar8 = 0x10;
      local_4278 = 0;
      UVar25 = 0;
      local_4218 = 0;
      uVar12 = 0;
      bVar30 = 0;
      bVar27 = 0;
      uVar19 = 0;
      uVar35 = 0;
      goto LAB_0010d8d2;
    }
    SVar11 = SkipData(&sd);
    if (SVar11 != 0) break;
LAB_0010d68c:
    SVar11 = ReadNumber(&sd,&type2);
    if (SVar11 != 0) break;
  }
  goto LAB_0010d038;
LAB_0010d8d2:
  uVar36 = uVar19 & 0xffffffff;
  if (local_4278 == uVar17) goto code_r0x0010dc6e;
  if (local_4270 == 0) {
    uVar14 = (UInt32)local_4278 - 1 >> 3;
    (info->db).IsDirs[uVar14] = bVar30;
    (info->db).CRCs.Defs[uVar14] = bVar27;
    local_4230 = (info->db).CRCs.Vals;
    local_4270 = 0x80;
    bVar30 = 0;
    bVar27 = 0;
  }
  pUVar22 = (info->db).UnpackPositions;
  pUVar22[local_4278] = UVar25;
  local_4230[local_4278] = 0;
  bVar26 = (byte)local_4278;
  if (local_41f8 == (Byte *)0x0) {
LAB_0010d9d1:
    if (uVar12 == 0) {
      while( true ) {
        SVar11 = SVar8;
        if ((info->db).db.NumFolders <= uVar36) goto LAB_0010d038;
        (info->db).FolderToFile[uVar36] = (UInt32)local_4278;
        type_1._0_4_ = 1;
        uVar19 = uVar36;
        if (local_41c8.sdNumSubStreams.Data == (Byte *)0x0) break;
        SVar11 = SzReadNumber32(&local_41c8.sdNumSubStreams,(UInt32 *)&type_1);
        if (SVar11 != 0) goto LAB_0010d038;
        uVar12 = (uint)type_1;
        if ((uint)type_1 != 0) goto LAB_0010d9d6;
        puVar2 = (info->db).db.CoderUnpackSizes +
                 ((uint)(info->db).db.FoToMainUnpackSizeIndex[uVar36] +
                 (info->db).db.FoToCoderUnpackSizes[uVar36]);
        bVar38 = CARRY8(UVar25,*puVar2);
        UVar25 = UVar25 + *puVar2;
        SVar11 = SVar8;
        if (bVar38) goto LAB_0010d038;
        uVar36 = uVar36 + 1;
      }
      uVar12 = 1;
    }
LAB_0010d9d6:
    (info->db).FileToFolder[local_4278] = (UInt32)uVar19;
    if (local_41f8 != (Byte *)0x0) {
      uVar24 = local_4278 >> 3 & 0x1fffffff;
      uVar14 = 0x80 >> (bVar26 & 7);
LAB_0010dabe:
      if ((uVar14 & local_41f8[uVar24]) != 0) goto LAB_0010dc4a;
    }
    uVar12 = uVar12 - 1;
    if (uVar12 == 0) {
      uVar29 = uVar19 & 0xffffffff;
      uVar36 = (info->db).db.CoderUnpackSizes
               [(uint)(info->db).db.FoToMainUnpackSizeIndex[uVar29] +
                (info->db).db.FoToCoderUnpackSizes[uVar29]];
      uVar24 = pUVar22[(info->db).FolderToFile[uVar29]];
      SVar11 = SVar8;
      if ((uVar36 < UVar25 - uVar24) || (UVar25 = uVar24 + uVar36, CARRY8(uVar24,uVar36)))
      goto LAB_0010d038;
      if (((uint)type_1 == 1) &&
         ((pBVar23 = (info->db).db.FolderCRCs.Defs, pBVar23 != (Byte *)0x0 &&
          ((char)(pBVar23[local_4278 >> 3 & 0x1fffffff] << (bVar26 & 7)) < '\0')))) {
        local_4230[local_4278] = (info->db).db.FolderCRCs.Vals[uVar29];
LAB_0010dc38:
        bVar27 = bVar27 | local_4270;
      }
      else if ((!bVar5) || ((local_4220 != (Byte *)0x0 && ((char)*local_4220 < '\0')))) {
        local_4230[local_4278] = *(UInt32 *)(local_4210 + local_4218 * 4);
        local_4218 = (ulong)((int)local_4218 + 1);
        goto LAB_0010dc38;
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      uVar12 = 0;
    }
    else {
      SVar11 = ReadNumber(&local_41c8.sdSizes,&type2);
      if ((SVar11 != 0) ||
         (bVar38 = CARRY8(UVar25,type2), UVar25 = UVar25 + type2, SVar11 = SVar8, bVar38))
      goto LAB_0010d038;
      if ((!bVar5) || ((local_4220 != (Byte *)0x0 && ((char)*local_4220 < '\0')))) {
        local_4230[local_4278] = *(UInt32 *)(local_4210 + local_4218 * 4);
        local_4218 = (ulong)((int)local_4218 + 1);
        bVar27 = bVar27 | local_4270;
      }
    }
  }
  else {
    uVar24 = local_4278 >> 3 & 0x1fffffff;
    uVar14 = 0x80 >> (bVar26 & 7);
    if ((uVar14 & local_41f8[uVar24]) == 0) goto LAB_0010d9d1;
    bVar31 = local_4270;
    if (local_41f0 != (Byte *)0x0) {
      if ((char)(local_41f0[uVar35 >> 3] << ((byte)uVar35 & 7)) < '\0') {
        bVar31 = 0;
      }
      uVar35 = uVar35 + 1;
    }
    bVar30 = bVar31 | bVar30;
    pUVar21 = (info->db).FileToFolder;
    if (uVar12 != 0) {
      pUVar21[local_4278] = (UInt32)uVar19;
      goto LAB_0010dabe;
    }
    pUVar21[local_4278] = 0xffffffff;
    uVar12 = 0;
  }
LAB_0010dc4a:
  local_4270 = local_4270 >> 1;
  local_4278 = local_4278 + 1;
  goto LAB_0010d8d2;
code_r0x0010dcd2:
  SVar11 = SVar8;
  if (((local_41c8.sdNumSubStreams.Data == (Byte *)0x0) ||
      (SVar11 = SzReadNumber32(&local_41c8.sdNumSubStreams,(UInt32 *)&type_1), SVar11 != 0)) ||
     (uVar36 = uVar36 + 1, SVar11 = SVar8, (uint)type_1 != 0)) goto LAB_0010d038;
  goto LAB_0010dcb9;
switchD_0010d3ad_caseD_e:
  if (sd.Size < uVar19) goto LAB_0010d038;
  local_41f8 = sd.Data;
  sd.Data = sd.Data + uVar19;
  sd.Size = sd.Size - uVar19;
  UVar13 = CountDefinedBits(pBVar23,UVar10);
  goto LAB_0010d30e;
code_r0x0010dc6e:
  uVar35 = UVar10 - 1 >> 3;
  (info->db).IsDirs[uVar35] = bVar30;
  (info->db).CRCs.Defs[uVar35] = bVar27;
  (info->db).UnpackPositions[uVar17] = UVar25;
  SVar11 = SVar8;
  if (uVar12 == 0) {
    pUVar21 = (info->db).FolderToFile;
LAB_0010dcb9:
    pUVar21[uVar36] = UVar10;
    if (uVar36 < (info->db).db.NumFolders) goto code_r0x0010dcd2;
    if (local_41c8.sdNumSubStreams.Size == 0 || local_41c8.sdNumSubStreams.Data == (Byte *)0x0) {
LAB_0010dd17:
      SVar11 = 0;
    }
    else {
LAB_0010dd24:
      SVar11 = 0x10;
    }
  }
LAB_0010d038:
  for (lVar18 = 0; lVar18 != 0x80; lVar18 = lVar18 + 0x10) {
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,*(void **)((long)&pos + lVar18));
    *(undefined8 *)((long)&pos + lVar18) = 0;
    *(undefined8 *)((long)&p_Stack_4100 + lVar18) = 0;
  }
  SVar8 = 0xb;
  if (sd.Size == 0) {
    SVar8 = 0;
  }
  if (SVar11 != 0) {
    SVar8 = SVar11;
  }
LAB_0010d088:
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,local_4228);
  pIVar28 = local_4228;
  if (SVar8 == 0) {
LAB_0010d0a8:
    idx = 0;
    iVar7 = __PHYSFS_DirTreeInit((__PHYSFS_DirTree *)info,0x30,1,0);
    if (iVar7 != 0) {
      UVar10 = (info->db).NumFiles;
      do {
        if (UVar10 == idx) {
          return info;
        }
        iVar7 = szipLoadEntry(info,idx);
        idx = idx + 1;
      } while (iVar7 != 0);
    }
  }
  else {
LAB_0010ccb4:
    SzArEx_Free(&info->db,pIVar28);
    PVar9 = szipErrorCode(SVar8);
    PHYSFS_setErrorCode(PVar9);
  }
  info->io = (PHYSFS_Io *)0x0;
  SZIP_closeArchive(info);
  return (void *)0x0;
}

Assistant:

static void *SZIP_openArchive(PHYSFS_Io *io, const char *name,
                              int forWriting, int *claimed)
{
    static const PHYSFS_uint8 wantedsig[] = { '7','z',0xBC,0xAF,0x27,0x1C };
    SZIPLookToRead stream;
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPinfo *info = NULL;
    SRes rc;
    PHYSFS_uint8 sig[6];
    PHYSFS_sint64 pos;

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    pos = io->tell(io);
    BAIL_IF_ERRPASS(pos == -1, NULL);
    BAIL_IF_ERRPASS(io->read(io, sig, 6) != 6, NULL);
    *claimed = (memcmp(sig, wantedsig, 6) == 0);
    BAIL_IF_ERRPASS(!io->seek(io, pos), NULL);

    info = (SZIPinfo *) allocator.Malloc(sizeof (SZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (*info));

    SzArEx_Init(&info->db);

    info->io = io;

    szipInitStream(&stream, io);
    rc = SzArEx_Open(&info->db, &stream.lookStream.s, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), failed);

    GOTO_IF_ERRPASS(!szipLoadEntries(info), failed);

    return info;

failed:
    info->io = NULL;  /* don't let cleanup destroy the PHYSFS_Io. */
    SZIP_closeArchive(info);
    return NULL;
}